

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O0

void nn_aws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_epbase *self_00;
  uint8_t msg_type_00;
  int errnum;
  nn_aws *local_48;
  size_t sStack_38;
  uint8_t msg_type;
  size_t sz;
  nn_aws *pnStack_28;
  int val;
  nn_aws *aws;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_48 = (nn_aws *)self;
  if (self == (nn_fsm *)0x0) {
    local_48 = (nn_aws *)0x0;
  }
  pnStack_28 = local_48;
  aws = (nn_aws *)srcptr;
  srcptr_local._0_4_ = type;
  srcptr_local._4_4_ = src;
  _type_local = self;
  switch(local_48->state) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_48->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0xad);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_48->state,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0xa9);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_accept(&local_48->usock,local_48->listener);
    pnStack_28->state = 2;
    break;
  case 2:
    if (src == 1) {
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_48->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,0xe9);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_epbase_clear_error(local_48->epbase);
      sStack_38 = 4;
      nn_epbase_getopt(pnStack_28->epbase,0,2,(void *)((long)&sz + 4),&stack0xffffffffffffffc8);
      if (sStack_38 != 4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,0xc0);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt(&pnStack_28->usock,1,7,(void *)((long)&sz + 4),4);
      sStack_38 = 4;
      nn_epbase_getopt(pnStack_28->epbase,0,3,(void *)((long)&sz + 4),&stack0xffffffffffffffc8);
      if (sStack_38 != 4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,0xc6);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt(&pnStack_28->usock,1,8,(void *)((long)&sz + 4),4);
      sStack_38 = 4;
      nn_epbase_getopt(pnStack_28->epbase,-4,1,(void *)((long)&sz + 4),&stack0xffffffffffffffc8);
      msg_type_00 = sz._4_1_;
      sz._4_4_ = 0;
      sStack_38 = 4;
      nn_usock_setsockopt(&pnStack_28->usock,1,0x14,(void *)((long)&sz + 4),4);
      nn_usock_swap_owner(pnStack_28->listener,&pnStack_28->listener_owner);
      pnStack_28->listener = (nn_usock *)0x0;
      (pnStack_28->listener_owner).src = -1;
      (pnStack_28->listener_owner).fsm = (nn_fsm *)0x0;
      nn_fsm_raise(&pnStack_28->fsm,&pnStack_28->accepted,0x85b7);
      nn_usock_activate(&pnStack_28->usock);
      nn_sws_start(&pnStack_28->sws,&pnStack_28->usock,2,(char *)0x0,(char *)0x0,msg_type_00);
      pnStack_28->state = 3;
      nn_epbase_stat_increment(pnStack_28->epbase,0x66,1);
    }
    else {
      if (src != 3) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_48->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,0xfc);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 6) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_48->state,3,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,0xf8);
        fflush(_stderr);
        nn_err_abort();
      }
      self_00 = local_48->epbase;
      errnum = nn_usock_geterrno(local_48->listener);
      nn_epbase_set_error(self_00,errnum);
      nn_epbase_stat_increment(pnStack_28->epbase,0x6b,1);
      nn_usock_accept(&pnStack_28->usock,pnStack_28->listener);
    }
    break;
  case 3:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_48->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0x118);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 1) {
      nn_sws_stop(&local_48->sws);
      pnStack_28->state = 4;
      nn_epbase_stat_increment(pnStack_28->epbase,0x68,1);
    }
    else {
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_48->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,0x114);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sws_stop(&local_48->sws);
      pnStack_28->state = 4;
    }
    break;
  case 4:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_48->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0x12e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 3) {
      nn_usock_stop(&local_48->usock);
      pnStack_28->state = 5;
    }
    else if (type != 8) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_48->state,2,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0x12a);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case 5:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_48->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0x143);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 7) {
      nn_aws_stop(local_48);
    }
    else if (type != 8) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_48->state,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
              ,0x13f);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)(uint)local_48->state,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
            ,0x14a);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_aws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aws *aws;
    int val;
    size_t sz;
    uint8_t msg_type;

    aws = nn_cont (self, struct nn_aws, fsm);

    switch (aws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_AWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&aws->usock, aws->listener);
                aws->state = NN_AWS_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_AWS_STATE_ACCEPTING:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_epbase_clear_error (aws->epbase);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_epbase_getopt (aws->epbase, NN_SOL_SOCKET, NN_SNDBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_epbase_getopt (aws->epbase, NN_SOL_SOCKET, NN_RCVBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_epbase_getopt (aws->epbase, NN_WS, NN_WS_MSG_TYPE,
                    &val, &sz);
                msg_type = (uint8_t)val;

                /*   Since the WebSocket handshake must poll, the receive
                     timeout is set to zero. Later, it will be set again
                     to the value specified by the socket option. */
                val = 0;
                sz = sizeof (val);
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVTIMEO,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (aws->listener, &aws->listener_owner);
                aws->listener = NULL;
                aws->listener_owner.src = -1;
                aws->listener_owner.fsm = NULL;
                nn_fsm_raise (&aws->fsm, &aws->accepted, NN_AWS_ACCEPTED);

                /*  Start the sws state machine. */
                nn_usock_activate (&aws->usock);
                nn_sws_start (&aws->sws, &aws->usock, NN_WS_SERVER,
                    NULL, NULL, msg_type);
                aws->state = NN_AWS_STATE_ACTIVE;

                nn_epbase_stat_increment (aws->epbase,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        case NN_AWS_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_epbase_set_error (aws->epbase,
                    nn_usock_geterrno (aws->listener));
                nn_epbase_stat_increment (aws->epbase,
                    NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&aws->usock, aws->listener);
                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_AWS_STATE_ACTIVE:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_SWS_RETURN_CLOSE_HANDSHAKE:
                /*  Peer closed connection without intention to reconnect, or
                    local endpoint failed remote because of invalid data. */
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                return;
            case NN_SWS_RETURN_ERROR:
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                nn_epbase_stat_increment (aws->epbase,
                    NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SWS state.                                                       */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_SWS:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SWS_RETURN_STOPPED:
                nn_usock_stop (&aws->usock);
                aws->state = NN_AWS_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_aws_stop (aws);
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (aws->state, src, type);
    }
}